

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

bool __thiscall cmCTestRunTest::StartTest(cmCTestRunTest *this,size_t completed,size_t total)

{
  string *psVar1;
  cmCTest *pcVar2;
  cmCTestTestProperties *pcVar3;
  char *pcVar4;
  pointer pbVar5;
  cmCTestRunTest *pcVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  ulong uVar10;
  cmProcess *pcVar11;
  _Base_ptr p_Var12;
  ostream *poVar13;
  long lVar14;
  string *psVar15;
  uint uVar16;
  ulong *puVar17;
  _Rb_tree_header *p_Var18;
  long lVar19;
  pointer __p_3;
  pointer __p;
  pointer pbVar20;
  cmDuration testTimeOut;
  double dVar21;
  string testName;
  ostringstream cmCTestLog_msg;
  ulong *local_210;
  char *local_208;
  ulong local_200;
  long lStack_1f8;
  cmCTestRunTest *local_1f0;
  string local_1e8;
  string *local_1c8;
  cmCTestTestProperties *local_1c0;
  string *local_1b8;
  unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  this->TotalNumberOfTests = total;
  if (this->CTest->TestProgressOutput == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    uVar10 = 10;
    if (9 < total) {
      uVar16 = 10;
      do {
        uVar16 = uVar16 + 2;
        bVar7 = 99 < total;
        total = total / 10;
      } while (bVar7);
      uVar10 = (ulong)uVar16;
    }
    *(ulong *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x10)) = uVar10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Start ",6);
    uVar10 = (ulong)this->TestHandler->MaxIndex;
    lVar19 = 1;
    if (9 < uVar10) {
      do {
        lVar19 = lVar19 + 1;
        bVar7 = 99 < uVar10;
        uVar10 = uVar10 / 10;
      } while (bVar7);
    }
    *(long *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x10)) = lVar19;
    poVar13 = (ostream *)std::ostream::operator<<(local_1a8,this->TestProperties->Index);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ",2);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,(this->TestProperties->Name)._M_dataplus._M_p,
                         (this->TestProperties->Name)._M_string_length);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1aa,(char *)local_210,false);
    if (local_210 != &local_200) {
      operator_delete(local_210,local_200 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    GetTestPrefix_abi_cxx11_(&local_1e8,this,completed,total);
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1e8,
                                (ulong)(this->TestProperties->Name)._M_dataplus._M_p);
    pcVar11 = (cmProcess *)(plVar9 + 2);
    if ((cmProcess *)*plVar9 == pcVar11) {
      local_198[0]._0_8_ = (pcVar11->Timeout).__r;
      local_198[0]._8_8_ = plVar9[3];
      local_1a8._0_8_ = (cmProcess *)(local_1a8 + 0x10);
    }
    else {
      local_198[0]._0_8_ = (pcVar11->Timeout).__r;
      local_1a8._0_8_ = (cmProcess *)*plVar9;
    }
    local_1a8._8_8_ = plVar9[1];
    *plVar9 = (long)pcVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append(local_1a8);
    puVar17 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar17) {
      local_200 = *puVar17;
      lStack_1f8 = plVar9[3];
      local_210 = &local_200;
    }
    else {
      local_200 = *puVar17;
      local_210 = (ulong *)*plVar9;
    }
    local_208 = (char *)plVar9[1];
    *plVar9 = (long)puVar17;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((cmProcess *)local_1a8._0_8_ != (cmProcess *)(local_1a8 + 0x10)) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_210,(long)local_208);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1ae,local_1e8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (local_210 != &local_200) {
      operator_delete(local_210,local_200 + 1);
    }
  }
  (this->ProcessOutput)._M_string_length = 0;
  *(this->ProcessOutput)._M_dataplus._M_p = '\0';
  pcVar3 = this->TestProperties;
  (this->TestResult).Properties = pcVar3;
  (this->TestResult).ExecutionTime.__r = 0.0;
  (this->TestResult).CompressOutput = false;
  (this->TestResult).ReturnValue = -1;
  (this->TestResult).TestCount = pcVar3->Index;
  std::__cxx11::string::_M_assign((string *)&this->TestResult);
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).Path);
  pcVar4 = (char *)(this->TestResult).CompletionStatus._M_string_length;
  psVar1 = &(this->TestResult).CompletionStatus;
  if (this->TestProperties->Disabled == true) {
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar4,0x53b1c6);
    (this->TestResult).Status = 0;
    pcVar11 = (cmProcess *)operator_new(0x128);
    cmProcess::cmProcess(pcVar11,this);
    local_1a8._0_8_ = (__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>)0x0;
    std::__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>::reset
              ((__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_> *)&this->TestProcess,
               pcVar11);
    std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
              ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)local_1a8);
    std::__cxx11::string::_M_replace
              ((ulong)&(this->TestResult).Output,0,
               (char *)(this->TestResult).Output._M_string_length,0x53b1c6);
    (this->TestResult).FullCommandLine._M_string_length = 0;
    *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
    return false;
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar4,0x53ec5e);
  (this->TestResult).Status = 8;
  local_1c8 = psVar1;
  if ((this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ComputeArguments(this);
    local_1c0 = this->TestProperties;
    pbVar20 = (local_1c0->Args).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(local_1c0->Args).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20) < 0x21) ||
       (iVar8 = std::__cxx11::string::compare((char *)(pbVar20 + 1)), iVar8 != 0)) {
      pbVar20 = (this->TestProperties->RequiredFiles).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = (this->TestProperties->RequiredFiles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar20 != pbVar5) {
        local_1b0 = &this->TestProcess;
        local_1b8 = (string *)&(this->TestResult).Output;
        do {
          bVar7 = cmsys::SystemTools::FileExists(pbVar20);
          if (!bVar7) {
            local_1f0 = (cmCTestRunTest *)CONCAT71(local_1f0._1_7_,bVar7);
            pcVar11 = (cmProcess *)operator_new(0x128);
            cmProcess::cmProcess(pcVar11,this);
            local_1a8._0_8_ = (__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>)0x0;
            std::__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>::reset
                      ((__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_> *)local_1b0,
                       pcVar11);
            std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
                      ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)local_1a8);
            poVar13 = this->TestHandler->LogFile;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,"Unable to find required file: ",0x1e);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(pbVar20->_M_dataplus)._M_p,pbVar20->_M_string_length);
            std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
            std::ostream::put((char)poVar13);
            std::ostream::flush();
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Unable to find required file: ",0x1e);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(pbVar20->_M_dataplus)._M_p,
                                 pbVar20->_M_string_length);
            std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
            std::ostream::put((char)poVar13);
            std::ostream::flush();
            pcVar2 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                         ,0x1f9,(char *)local_210,false);
            if (local_210 != &local_200) {
              operator_delete(local_210,local_200 + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8,"Unable to find required file: ",pbVar20);
            std::__cxx11::string::operator=(local_1b8,(string *)local_1a8);
            if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,
                              (ulong)(local_198[0]._M_allocated_capacity + 1));
            }
            (this->TestResult).FullCommandLine._M_string_length = 0;
            *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
            std::__cxx11::string::_M_replace
                      ((ulong)local_1c8,0,
                       (char *)(this->TestResult).CompletionStatus._M_string_length,0x53ed42);
            (this->TestResult).Status = 0;
            if ((char)local_1f0 == '\0') {
              return false;
            }
          }
          pbVar20 = pbVar20 + 1;
        } while (pbVar20 != pbVar5);
      }
      if ((this->ActualCommand)._M_string_length == 0) {
        pcVar11 = (cmProcess *)operator_new(0x128);
        cmProcess::cmProcess(pcVar11,this);
        local_1a8._0_8_ = (__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>)0x0;
        std::__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>::reset
                  ((__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_> *)&this->TestProcess
                   ,pcVar11);
        std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
                  ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)local_1a8);
        poVar13 = this->TestHandler->LogFile;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"Unable to find executable: ",0x1b);
        pcVar3 = local_1c0;
        pbVar20 = (local_1c0->Args).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,pbVar20[1]._M_dataplus._M_p,pbVar20[1]._M_string_length);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Unable to find executable: ",0x1b);
        pbVar20 = (pcVar3->Args).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,pbVar20[1]._M_dataplus._M_p,
                             pbVar20[1]._M_string_length);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x209,(char *)local_210,false);
        if (local_210 != &local_200) {
          operator_delete(local_210,local_200 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"Unable to find executable: ",
                       (pcVar3->Args).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
        std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)local_1a8);
        if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
        }
        (this->TestResult).FullCommandLine._M_string_length = 0;
        *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
        std::__cxx11::string::_M_replace
                  ((ulong)local_1c8,0,(char *)(this->TestResult).CompletionStatus._M_string_length,
                   0x53ed75);
        (this->TestResult).Status = 0;
        return false;
      }
      cmCTest::CurrentTime_abi_cxx11_((string *)local_1a8,this->CTest);
      std::__cxx11::string::operator=((string *)&this->StartTime,(string *)local_1a8);
      if ((cmProcess *)local_1a8._0_8_ != (cmProcess *)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
      }
      testTimeOut.__r = (this->TestProperties->Timeout).__r;
      this->TimeoutIsForStopTime = false;
      lVar19 = (this->CTest->StopTime).__d.__r;
      if (lVar19 != 0) {
        local_1f0 = (cmCTestRunTest *)testTimeOut.__r;
        lVar14 = std::chrono::_V2::system_clock::now();
        dVar21 = (double)((lVar19 - lVar14) % 86400000000000) / 1000000000.0;
        if (dVar21 <= 0.0) {
          dVar21 = 0.0;
        }
        if ((((double)local_1f0 == 0.0) && (!NAN((double)local_1f0))) ||
           (testTimeOut.__r = (rep_conflict)local_1f0, dVar21 < (double)local_1f0)) {
          this->TimeoutIsForStopTime = true;
          testTimeOut.__r = dVar21;
        }
      }
      pcVar3 = this->TestProperties;
      bVar7 = ForkProcess(this,testTimeOut,pcVar3->ExplicitTimeout,&pcVar3->Environment,
                          &pcVar3->Affinity);
      return bVar7;
    }
    pcVar11 = (cmProcess *)operator_new(0x128);
    cmProcess::cmProcess(pcVar11,this);
    local_1a8._0_8_ = (__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>)0x0;
    std::__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>::reset
              ((__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_> *)&this->TestProcess,
               pcVar11);
    std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
              ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)local_1a8);
    local_208 = (char *)0x0;
    local_200 = local_200 & 0xffffffffffffff00;
    local_210 = &local_200;
    psVar15 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
    if (psVar15->_M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_210,0,local_208,0x53eca2);
    }
    else {
      std::__cxx11::string::_M_replace((ulong)&local_210,0,local_208,0x53ece7);
      psVar15 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
      std::__cxx11::string::_M_append((char *)&local_210,(ulong)(psVar15->_M_dataplus)._M_p);
    }
    std::__cxx11::string::append((char *)&local_210);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (this->TestHandler->LogFile,(char *)local_210,(long)local_208);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_210,(long)local_208);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1e9,local_1e8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    (this->TestResult).FullCommandLine._M_string_length = 0;
    *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->TestResult).CompletionStatus._M_string_length,0x53ed0d
              );
    (this->TestResult).Status = 0;
    if (local_210 == &local_200) {
      return false;
    }
  }
  else {
    pcVar11 = (cmProcess *)operator_new(0x128);
    cmProcess::cmProcess(pcVar11,this);
    local_1a8._0_8_ = (__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>)0x0;
    std::__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>::reset
              ((__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_> *)&this->TestProcess,
               pcVar11);
    std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
              ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)local_1a8);
    local_210 = &local_200;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,"Failed test dependencies:","");
    p_Var12 = (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var18 = &(this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header;
    local_1f0 = this;
    if ((_Rb_tree_header *)p_Var12 != p_Var18) {
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var12 + 1));
        std::__cxx11::string::_M_append((char *)&local_210,local_1a8._0_8_);
        if ((cmProcess *)local_1a8._0_8_ != (cmProcess *)(local_1a8 + 0x10)) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
        }
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != p_Var18);
    }
    pcVar6 = local_1f0;
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1f0->TestHandler->LogFile,(char *)local_210,(long)local_208);
    psVar1 = local_1c8;
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_210,(long)local_208);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar2 = pcVar6->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1d3,local_1e8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::_M_assign((string *)&(pcVar6->TestResult).Output);
    (pcVar6->TestResult).FullCommandLine._M_string_length = 0;
    *(pcVar6->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(pcVar6->TestResult).CompletionStatus._M_string_length,
               0x53ec88);
    (pcVar6->TestResult).Status = 0;
    if (local_210 == &local_200) {
      return false;
    }
  }
  operator_delete(local_210,local_200 + 1);
  return false;
}

Assistant:

bool cmCTestRunTest::StartTest(size_t completed, size_t total)
{
  this->TotalNumberOfTests = total; // save for rerun case
  if (!this->CTest->GetTestProgressOutput()) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               std::setw(2 * getNumWidth(total) + 8)
                 << "Start "
                 << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
                 << this->TestProperties->Index << ": "
                 << this->TestProperties->Name << std::endl);
  } else {
    std::string testName =
      GetTestPrefix(completed, total) + this->TestProperties->Name + "\n";
    cmCTestLog(this->CTest, HANDLER_TEST_PROGRESS_OUTPUT, testName);
  }

  this->ProcessOutput.clear();

  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = cmDuration::zero();
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory;

  // Return immediately if test is disabled
  if (this->TestProperties->Disabled) {
    this->TestResult.CompletionStatus = "Disabled";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    this->TestProcess = cm::make_unique<cmProcess>(*this);
    this->TestResult.Output = "Disabled";
    this->TestResult.FullCommandLine.clear();
    return false;
  }

  this->TestResult.CompletionStatus = "Failed to start";
  this->TestResult.Status = cmCTestTestHandler::BAD_COMMAND;

  // Check for failed fixture dependencies before we even look at the command
  // arguments because if we are not going to run the test, the command and
  // its arguments are irrelevant. This matters for the case where a fixture
  // dependency might be creating the executable we want to run.
  if (!this->FailedDependencies.empty()) {
    this->TestProcess = cm::make_unique<cmProcess>(*this);
    std::string msg = "Failed test dependencies:";
    for (std::string const& failedDep : this->FailedDependencies) {
      msg += " " + failedDep;
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine.clear();
    this->TestResult.CompletionStatus = "Fixture dependency failed";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  this->ComputeArguments();
  std::vector<std::string>& args = this->TestProperties->Args;
  if (args.size() >= 2 && args[1] == "NOT_AVAILABLE") {
    this->TestProcess = cm::make_unique<cmProcess>(*this);
    std::string msg;
    if (this->CTest->GetConfigType().empty()) {
      msg = "Test not available without configuration.";
      msg += "  (Missing \"-C <config>\"?)";
    } else {
      msg = "Test not available in configuration \"";
      msg += this->CTest->GetConfigType();
      msg += "\".";
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine.clear();
    this->TestResult.CompletionStatus = "Missing Configuration";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  // Check if all required files exist
  for (std::string const& file : this->TestProperties->RequiredFiles) {
    if (!cmSystemTools::FileExists(file)) {
      // Required file was not found
      this->TestProcess = cm::make_unique<cmProcess>(*this);
      *this->TestHandler->LogFile << "Unable to find required file: " << file
                                  << std::endl;
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to find required file: " << file << std::endl);
      this->TestResult.Output = "Unable to find required file: " + file;
      this->TestResult.FullCommandLine.clear();
      this->TestResult.CompletionStatus = "Required Files Missing";
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      return false;
    }
  }
  // log and return if we did not find the executable
  if (this->ActualCommand.empty()) {
    // if the command was not found create a TestResult object
    // that has that information
    this->TestProcess = cm::make_unique<cmProcess>(*this);
    *this->TestHandler->LogFile << "Unable to find executable: " << args[1]
                                << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Unable to find executable: " << args[1] << std::endl);
    this->TestResult.Output = "Unable to find executable: " + args[1];
    this->TestResult.FullCommandLine.clear();
    this->TestResult.CompletionStatus = "Unable to find executable";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }
  this->StartTime = this->CTest->CurrentTime();

  auto timeout = this->TestProperties->Timeout;

  this->TimeoutIsForStopTime = false;
  std::chrono::system_clock::time_point stop_time = this->CTest->GetStopTime();
  if (stop_time != std::chrono::system_clock::time_point()) {
    std::chrono::duration<double> stop_timeout =
      (stop_time - std::chrono::system_clock::now()) % std::chrono::hours(24);

    if (stop_timeout <= std::chrono::duration<double>::zero()) {
      stop_timeout = std::chrono::duration<double>::zero();
    }
    if (timeout == std::chrono::duration<double>::zero() ||
        stop_timeout < timeout) {
      this->TimeoutIsForStopTime = true;
      timeout = stop_timeout;
    }
  }

  return this->ForkProcess(timeout, this->TestProperties->ExplicitTimeout,
                           &this->TestProperties->Environment,
                           &this->TestProperties->Affinity);
}